

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

int64_t cab_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  archive_read *a_00;
  int64_t iVar1;
  archive_read *in_RSI;
  archive *in_RDI;
  ssize_t avail;
  wchar_t err;
  int64_t rbytes;
  int64_t cbytes;
  cfdata *cfdata;
  cab *cab;
  archive_read *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc4;
  archive_read *local_30;
  long local_28;
  int64_t consumed_bytes_00;
  
  consumed_bytes_00 = *(int64_t *)in_RDI[0x15].archive_format_name;
  a_00 = (archive_read *)cab_minimum_consume_cfdata(in_RSI,consumed_bytes_00);
  if (-1 < (long)a_00) {
    local_28 = *(long *)(consumed_bytes_00 + 0x38);
    do {
      while( true ) {
        while( true ) {
          if ((long)a_00 < 1) {
            return (int64_t)in_RSI;
          }
          if (*(short *)(local_28 + 4) == 0) {
            archive_set_error(in_RDI,0x54,"Invalid CFDATA");
            return -0x1e;
          }
          local_30 = (archive_read *)(ulong)*(ushort *)(local_28 + 10);
          if ((long)a_00 < (long)(ulong)*(ushort *)(local_28 + 10)) {
            local_30 = a_00;
          }
          a_00 = (archive_read *)((long)a_00 - (long)local_30);
          if ((*(short *)(local_28 + 0xc) != 0) ||
             ((*(short *)(*(long *)(consumed_bytes_00 + 0x30) + 0x10) != -1 &&
              (*(short *)(*(long *)(consumed_bytes_00 + 0x30) + 0x10) != -3)))) break;
          if (local_30 != (archive_read *)(ulong)*(ushort *)(local_28 + 10)) {
            *(short *)(local_28 + 0xe) = *(short *)(local_28 + 0xe) + (short)local_30;
            *(short *)(local_28 + 10) = *(short *)(local_28 + 10) - (short)local_30;
            return (int64_t)in_RSI;
          }
          __archive_read_consume
                    ((archive_read *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (int64_t)in_stack_ffffffffffffffb8);
          *(ulong *)(consumed_bytes_00 + 0x40) =
               (ulong)*(ushort *)(local_28 + 4) + *(long *)(consumed_bytes_00 + 0x40);
          *(undefined2 *)(local_28 + 6) = 0;
          *(undefined2 *)(local_28 + 10) = 0;
          in_stack_ffffffffffffffc4 = cab_next_cfdata(in_RSI);
          if (in_stack_ffffffffffffffc4 < L'\0') {
            return (long)in_stack_ffffffffffffffc4;
          }
          local_28 = *(long *)(consumed_bytes_00 + 0x38);
          if ((*(short *)(local_28 + 8) == 0) &&
             (*(ushort *)(*(long *)(consumed_bytes_00 + 0x30) + 0x10) - 0xfffd < 3)) {
            a_00 = (archive_read *)0x0;
          }
        }
        if (local_30 == (archive_read *)0x0) break;
        for (; 0 < (long)local_30;
            local_30 = (archive_read *)((long)local_30 - (long)in_stack_ffffffffffffffb8)) {
          cab_read_ahead_cfdata
                    (a_00,(ssize_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          if ((long)in_stack_ffffffffffffffb8 < 1) {
            return -0x1e;
          }
          if ((long)local_30 < (long)in_stack_ffffffffffffffb8) {
            in_stack_ffffffffffffffb8 = local_30;
          }
          iVar1 = cab_minimum_consume_cfdata(in_RSI,consumed_bytes_00);
          if (iVar1 < 0) {
            return -0x1e;
          }
        }
      }
      in_stack_ffffffffffffffc4 = cab_next_cfdata(in_RSI);
      if (in_stack_ffffffffffffffc4 < L'\0') {
        return (long)in_stack_ffffffffffffffc4;
      }
      local_28 = *(long *)(consumed_bytes_00 + 0x38);
    } while ((*(short *)(local_28 + 8) != 0) ||
            (2 < *(ushort *)(*(long *)(consumed_bytes_00 + 0x30) + 0x10) - 0xfffd));
  }
  return -0x1e;
}

Assistant:

static int64_t
cab_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	rbytes = cab_minimum_consume_cfdata(a, consumed_bytes);
	if (rbytes < 0)
		return (ARCHIVE_FATAL);

	cfdata = cab->entry_cfdata;
	while (rbytes > 0) {
		ssize_t avail;

		if (cfdata->compressed_size == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		}
		cbytes = cfdata->uncompressed_bytes_remaining;
		if (cbytes > rbytes)
			cbytes = rbytes;
		rbytes -= cbytes;

		if (cfdata->uncompressed_avail == 0 &&
		   (cab->entry_cffile->folder == iFoldCONTINUED_PREV_AND_NEXT ||
		    cab->entry_cffile->folder == iFoldCONTINUED_FROM_PREV)) {
			/* We have not read any data yet. */
			if (cbytes == cfdata->uncompressed_bytes_remaining) {
				/* Skip whole current CFDATA. */
				__archive_read_consume(a,
				    cfdata->compressed_size);
				cab->cab_offset += cfdata->compressed_size;
				cfdata->compressed_bytes_remaining = 0;
				cfdata->uncompressed_bytes_remaining = 0;
				err = cab_next_cfdata(a);
				if (err < 0)
					return (err);
				cfdata = cab->entry_cfdata;
				if (cfdata->uncompressed_size == 0) {
					switch (cab->entry_cffile->folder) {
					case iFoldCONTINUED_PREV_AND_NEXT:
					case iFoldCONTINUED_TO_NEXT:
					case iFoldCONTINUED_FROM_PREV:
						rbytes = 0;
						break;
					default:
						break;
					}
				}
				continue;
			}
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
			break;
		} else if (cbytes == 0) {
			err = cab_next_cfdata(a);
			if (err < 0)
				return (err);
			cfdata = cab->entry_cfdata;
			if (cfdata->uncompressed_size == 0) {
				switch (cab->entry_cffile->folder) {
				case iFoldCONTINUED_PREV_AND_NEXT:
				case iFoldCONTINUED_TO_NEXT:
				case iFoldCONTINUED_FROM_PREV:
					return (ARCHIVE_FATAL);
				default:
					break;
				}
			}
			continue;
		}
		while (cbytes > 0) {
			(void)cab_read_ahead_cfdata(a, &avail);
			if (avail <= 0)
				return (ARCHIVE_FATAL);
			if (avail > cbytes)
				avail = (ssize_t)cbytes;
			if (cab_minimum_consume_cfdata(a, avail) < 0)
				return (ARCHIVE_FATAL);
			cbytes -= avail;
		}
	}
	return (consumed_bytes);
}